

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_short,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  ushort uVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  float outValue;
  allocator_type local_55;
  uint local_54;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  float local_44;
  ImageT<unsigned_short,_4U> *local_40;
  ulong local_38;
  
  local_50 = __return_storage_ptr__;
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
                 );
  }
  uVar4 = targetBits >> 3;
  local_54 = numChannels;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar4 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_55);
  uVar5 = (this->super_Image).height;
  if (uVar5 != 0) {
    local_38 = (ulong)uVar4;
    uVar7 = (this->super_Image).width;
    uVar9 = (ulong)local_54;
    uVar8 = 0;
    uVar6 = local_54;
    uVar3 = uVar7;
    local_40 = this;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (uVar6 != 0) {
            puVar2 = (local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar10 = 0;
            do {
              uVar7 = (this->super_Image).width * uVar8 + uVar5;
              uVar1 = this->pixels[uVar7].field_0.comps[uVar10];
              if (targetBits == 0x20) {
                local_44 = (float)uVar1;
                memcpy(puVar2 + (uVar7 * uVar6 + (int)uVar10) * uVar4,&local_44,local_38);
                puVar2 = (local_50->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                this = local_40;
                uVar6 = local_54;
              }
              else if (targetBits == 0x10) {
                *(ushort *)(puVar2 + (uVar7 * uVar6 + (int)uVar10) * uVar4) = uVar1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
            uVar7 = (this->super_Image).width;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar7);
        uVar5 = (this->super_Image).height;
        uVar3 = uVar7;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar5);
  }
  return local_50;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }